

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

DdNode * Cudd_IndicesToCube(DdManager *dd,int *array,int n)

{
  ulong uVar1;
  DdNode *pDVar2;
  int local_3c;
  int i;
  DdNode *tmp;
  DdNode *cube;
  int n_local;
  int *array_local;
  DdManager *dd_local;
  
  tmp = dd->one;
  uVar1 = (ulong)tmp & 0xfffffffffffffffe;
  *(int *)(uVar1 + 4) = *(int *)(uVar1 + 4) + 1;
  local_3c = n + -1;
  while( true ) {
    if (local_3c < 0) {
      *(int *)(((ulong)tmp & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)tmp & 0xfffffffffffffffe) + 4) + -1;
      return tmp;
    }
    pDVar2 = Cudd_bddIthVar(dd,array[local_3c]);
    pDVar2 = Cudd_bddAnd(dd,pDVar2,tmp);
    if (pDVar2 == (DdNode *)0x0) break;
    *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
    Cudd_RecursiveDeref(dd,tmp);
    local_3c = local_3c + -1;
    tmp = pDVar2;
  }
  Cudd_RecursiveDeref(dd,tmp);
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_IndicesToCube(
  DdManager * dd,
  int * array,
  int  n)
{
    DdNode *cube, *tmp;
    int i;

    cube = DD_ONE(dd);
    cuddRef(cube);
    for (i = n - 1; i >= 0; i--) {
        tmp = Cudd_bddAnd(dd,Cudd_bddIthVar(dd,array[i]),cube);
        if (tmp == NULL) {
            Cudd_RecursiveDeref(dd,cube);
            return(NULL);
        }
        cuddRef(tmp);
        Cudd_RecursiveDeref(dd,cube);
        cube = tmp;
    }

    cuddDeref(cube);
    return(cube);

}